

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idefs.h
# Opt level: O0

void __thiscall Am_Input_Char::Am_Input_Char(Am_Input_Char *this,Am_Value *value)

{
  ulong uVar1;
  ushort uVar2;
  short high_bytes;
  short low_bytes;
  long l;
  Am_Value *value_local;
  Am_Input_Char *this_local;
  
  uVar1 = (value->value).long_value;
  if ((uVar1 != 0) && (value->type != (Am_Value_Type)Am_Input_Char_ID)) {
    Am_Error();
  }
  uVar2 = (ushort)(uVar1 >> 0x10);
  this->code = (short)uVar1;
  *(ushort *)&this->field_0x2 =
       *(ushort *)&this->field_0x2 & 0xfffe | (ushort)((uVar1 & 0x10000) != 0);
  *(ushort *)&this->field_0x2 =
       *(ushort *)&this->field_0x2 & 0xfffd | (ushort)((short)(uVar2 & 2) >> 1 != 0) << 1;
  *(ushort *)&this->field_0x2 =
       *(ushort *)&this->field_0x2 & 0xfffb | (ushort)((short)(uVar2 & 4) >> 2 != 0) << 2;
  *(ushort *)&this->field_0x2 =
       *(ushort *)&this->field_0x2 & 0xfff7 | (ushort)((short)(uVar2 & 8) >> 3 != 0) << 3;
  *(ushort *)&this->field_0x2 =
       *(ushort *)&this->field_0x2 & 0xff0f | ((short)(uVar2 & 0xf0) >> 4) << 4;
  *(ushort *)&this->field_0x2 =
       *(ushort *)&this->field_0x2 & 0xf0ff | ((short)(char)(uVar1 >> 0x18) & 0xfU) << 8;
  return;
}

Assistant:

Am_Input_Char(const Am_Value &value)
  {
    long l = value.value.long_value;
    if (l) {
      if (value.type != Am_Input_Char_ID) {
#ifdef DEBUG
        Am_Error("** Tried to set an Am_Input_Char with a non Am_Input_Char "
                 "wrapper.");
#else
        Am_Error();
#endif
      }
    }

    short low_bytes = (short)l;
    short high_bytes = (short)(l >> 16);

    code = low_bytes;
    shift = (high_bytes & AmShiftMask);
    control = (high_bytes & AmControlMask) >> 1;
    meta = (high_bytes & AmMetaMask) >> 2;
    any_modifier = (high_bytes & AmAnyModMask) >> 3;
    button_down = (Am_Button_Down)((high_bytes & AmBDownMask) >> 4);
    click_count = (Am_Click_Count)((high_bytes & AmCCountMask) >> 8);
  }